

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O3

void __thiscall
QHttp2ProtocolHandler::handleHeadersReceived
          (QHttp2ProtocolHandler *this,HttpHeader *headers,bool endStream)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  long lVar4;
  ContextType *reply;
  QHttpNetworkReplyPrivate *this_00;
  pointer pHVar5;
  char *pcVar6;
  storage_type *originalLength;
  bool bVar7;
  char cVar8;
  CutResult CVar9;
  QByteArray *data;
  QHttpNetworkRequestPrivate *pQVar10;
  QNonContiguousByteDevice *pQVar11;
  long lVar12;
  QSharedDataPointer<QHttpNetworkRequestPrivate> *this_01;
  storage_type *psVar13;
  QArrayData *pQVar14;
  longlong lVar15;
  QMetaTypeInterface *pQVar16;
  int iVar17;
  ulong uVar18;
  HeaderField *pair;
  pointer lhs;
  QHttpNetworkRequest *this_02;
  long in_FS_OFFSET;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QHttp2Stream *stream;
  QString local_88;
  QHttp2Stream *local_70;
  undefined1 local_68 [16];
  QMetaMethodReturnArgument local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::sender();
  local_70 = (QHttp2Stream *)QMetaObject::cast((QObject *)&QHttp2Stream::staticMetaObject);
  QHash<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>::
  tryEmplace_impl<QHttp2Stream*const&>
            ((TryEmplaceResult *)&local_58,
             (QHash<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>> *)(this + 0x50)
             ,&local_70);
  lVar12 = ((ulong)local_58.name >> 7) * 0x90;
  lVar4 = *(long *)((local_58.metaType)->defaultCtr + lVar12 + 0x80);
  bVar3 = (byte)(local_58.metaType)->defaultCtr[(ulong)((uint)local_58.name & 0x7f) + lVar12];
  lVar12 = (ulong)bVar3 * 0x20;
  reply = *(ContextType **)(lVar4 + 0x18 + lVar12);
  this_00 = *(QHttpNetworkReplyPrivate **)&reply->field_0x8;
  lhs = (headers->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
        _M_impl.super__Vector_impl_data._M_start;
  pHVar5 = (headers->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (lhs == pHVar5) {
    iVar17 = 0;
  }
  else {
    uVar18 = 0;
    do {
      pcVar6 = (lhs->value).d.ptr;
      originalLength = (storage_type *)(lhs->value).d.size;
      local_58.metaType = (QMetaTypeInterface *)0x264385;
      bVar7 = ::operator==(&lhs->name,(char **)&local_58);
      if (bVar7) {
        psVar13 = (storage_type *)0x3;
        if (originalLength < (storage_type *)0x3) {
          psVar13 = originalLength;
        }
        local_58.data = &DAT_aaaaaaaaaaaaaaaa;
        local_58.metaType = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.name = &DAT_aaaaaaaaaaaaaaaa;
        QVar19.m_data = psVar13;
        QVar19.m_size = (qsizetype)&local_58;
        QtPrivate::toSignedInteger(QVar19,(int)pcVar6);
        uVar18 = 0;
        if ((ulong)&local_58.metaType[0x1249249].metaObjectFn >> 0x20 == 0) {
          uVar18 = (ulong)local_58.metaType & 0xffffffff;
        }
        if (((ulong)local_58.name & 1) != 0) {
          uVar18 = 0;
        }
        QHttpNetworkReply::setStatusCode((QHttpNetworkReply *)reply,(int)uVar18);
        *(int *)(*(long *)(this + 0x18) + 0x54) = (int)uVar18;
        local_58.metaType = (QMetaTypeInterface *)&DAT_00000004;
        local_88.d.d = (Data *)0xffffffffffffffff;
        CVar9 = QtPrivate::QContainerImplHelper::mid
                          ((qsizetype)originalLength,(qsizetype *)&local_58,(qsizetype *)&local_88);
        pQVar14 = &(local_88.d.d)->super_QArrayData;
        if (CVar9 == Null) {
          pQVar14 = (QArrayData *)0x0;
        }
        QVar20.m_data = (storage_type *)pQVar14;
        QVar20.m_size = (qsizetype)&local_58;
        QString::fromLatin1(QVar20);
        QHttpNetworkReply::setReasonPhrase((QHttpNetworkReply *)reply,(QString *)&local_58);
        if (local_58.metaType != (QMetaTypeInterface *)0x0) {
          LOCK();
          *(int *)local_58.metaType = *(int *)local_58.metaType + -1;
          iVar1._0_2_ = (local_58.metaType)->revision;
          iVar1._2_2_ = (local_58.metaType)->alignment;
          UNLOCK();
          if (iVar1 == 0) {
            lVar15 = 2;
LAB_001f50f1:
            QArrayData::deallocate((QArrayData *)local_58.metaType,lVar15,0x10);
          }
        }
      }
      else {
        local_58.metaType = (QMetaTypeInterface *)0x2687f5;
        bVar7 = ::operator==(&lhs->name,(char **)&local_58);
        if (bVar7) {
          QHttpNetworkReply::setMajorVersion((QHttpNetworkReply *)reply,pcVar6[5] + -0x30);
          QHttpNetworkReply::setMinorVersion((QHttpNetworkReply *)reply,pcVar6[7] + -0x30);
        }
        else {
          local_58.metaType = (QMetaTypeInterface *)0x25d950;
          bVar7 = ::operator==(&lhs->name,(char **)&local_58);
          if (bVar7) {
            local_58.data = &DAT_aaaaaaaaaaaaaaaa;
            local_58.metaType = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
            local_58.name = &DAT_aaaaaaaaaaaaaaaa;
            QVar21.m_data = originalLength;
            QVar21.m_size = (qsizetype)&local_58;
            QtPrivate::toSignedInteger(QVar21,(int)pcVar6);
            if (((ulong)local_58.name & 1) == 0) {
              pQVar16 = local_58.metaType;
              if (((ulong)local_58.name & 1) != 0) {
                pQVar16 = (QMetaTypeInterface *)0x0;
              }
              (**(code **)(*(long *)reply + 0x88))(reply,pQVar16);
            }
          }
          else {
            local_58.metaType = (QMetaTypeInterface *)0x25d9af;
            bVar7 = ::operator==(&lhs->name,(char **)&local_58);
            local_58.metaType = (QMetaTypeInterface *)(lhs->value).d.d;
            local_58.name = (lhs->value).d.ptr;
            local_58.data = (void *)(lhs->value).d.size;
            if (local_58.metaType != (QMetaTypeInterface *)0x0) {
              LOCK();
              *(int *)local_58.metaType = *(int *)local_58.metaType + 1;
              UNLOCK();
            }
            QVar23.m_data = (storage_type *)(2 - (ulong)bVar7);
            local_88.d.d = (Data *)((ulong)local_88.d.d & 0xffffffffffffff00);
            QVar22.m_data = (storage_type *)0x1;
            QVar22.m_size = (qsizetype)&local_58;
            QVar23.m_size = (qsizetype)&local_88;
            data = (QByteArray *)QByteArray::replace(QVar22,QVar23);
            QHttpNetworkReply::appendHeaderField((QHttpNetworkReply *)reply,&lhs->name,data);
            if (local_58.metaType != (QMetaTypeInterface *)0x0) {
              LOCK();
              *(int *)local_58.metaType = *(int *)local_58.metaType + -1;
              iVar17._0_2_ = (local_58.metaType)->revision;
              iVar17._2_2_ = (local_58.metaType)->alignment;
              UNLOCK();
              if (iVar17 == 0) {
                lVar15 = 1;
                goto LAB_001f50f1;
              }
            }
          }
        }
      }
      iVar17 = (int)uVar18;
      lhs = lhs + 1;
    } while (lhs != pHVar5);
  }
  if (iVar17 - 0x66U < 0x62 || iVar17 == 100) {
    QHttpNetworkReplyPrivate::clearHttpLayerInformation(this_00);
  }
  else {
    this_02 = (QHttpNetworkRequest *)(lVar12 + lVar4 + 8);
    bVar7 = QHttpNetworkReply::isHttpRedirect(iVar17);
    if ((bVar7) && (bVar7 = QHttpNetworkRequest::isFollowRedirects(this_02), bVar7)) {
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QHttpNetworkConnectionPrivate::parseRedirectResponse
                ((QHttpNetworkConnectionPrivate *)local_68,reply);
      if (local_68._8_4_ != NoError) {
        local_58.data = &DAT_aaaaaaaaaaaaaaaa;
        local_58.metaType = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.name = &DAT_aaaaaaaaaaaaaaaa;
        local_88.d.d = (Data *)0x0;
        local_88.d.ptr = (char16_t *)0x0;
        local_88.d.size = 0;
        QHttpNetworkConnectionPrivate::errorDetail
                  ((QString *)&local_58,
                   *(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0x30) + 8),local_68._8_4_,
                   *(QIODevice **)(this + 0x28),&local_88);
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          }
        }
        finishStreamWithError(this,local_70,local_68._8_4_,(QString *)&local_58);
        QHttp2Stream::sendRST_STREAM((QHttp2Stream *)local_70,INTERNAL_ERROR);
        if (local_58.metaType != (QMetaTypeInterface *)0x0) {
          LOCK();
          *(int *)local_58.metaType = *(int *)local_58.metaType + -1;
          iVar2._0_2_ = (local_58.metaType)->revision;
          iVar2._2_2_ = (local_58.metaType)->alignment;
          UNLOCK();
          if (iVar2 == 0) {
            QArrayData::deallocate((QArrayData *)local_58.metaType,2,0x10);
          }
        }
        QUrl::~QUrl((QUrl *)local_68);
        goto LAB_001f545f;
      }
      cVar8 = QUrl::isValid();
      if (cVar8 != '\0') {
        QHttpNetworkReply::setRedirectUrl((QHttpNetworkReply *)reply,(QUrl *)local_68);
      }
      QUrl::~QUrl((QUrl *)local_68);
    }
    bVar7 = QHttpNetworkReplyPrivate::isCompressed(this_00);
    if (bVar7) {
      lVar12 = (ulong)bVar3 * 0x20;
      pQVar10 = *(QHttpNetworkRequestPrivate **)(lVar4 + 0x10 + lVar12);
      if ((__int_type)
          (pQVar10->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>
          .super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1) {
        this_01 = (QSharedDataPointer<QHttpNetworkRequestPrivate> *)(lVar12 + lVar4 + 0x10);
        QSharedDataPointer<QHttpNetworkRequestPrivate>::detach_helper(this_01);
        pQVar10 = (this_01->d).ptr;
      }
      if (pQVar10->autoDecompress == true) {
        QHttpNetworkReplyPrivate::removeAutoDecompressHeader(this_00);
      }
    }
    bVar7 = QHttpNetworkReply::isHttpRedirect(iVar17);
    if ((bVar7) &&
       (pQVar11 = QHttpNetworkRequest::uploadByteDevice(this_02),
       pQVar11 != (QNonContiguousByteDevice *)0x0)) {
      (**(code **)(*(long *)pQVar11 + 0x80))(pQVar11);
      this_00->totallyUploadedData = 0;
    }
    local_88.d.d = (Data *)QHttpNetworkReply::headerChanged;
    local_88.d.ptr = (char16_t *)0x0;
    local_58.metaType = &QtPrivate::QMetaTypeInterfaceWrapper<void>::metaType;
    local_58.name = (char *)0x0;
    local_58.data = (undefined1 *)0x0;
    QMetaObject::invokeMethodCallableHelper<void(QHttpNetworkReply::*)()>
              (reply,(offset_in_QHttpNetworkReply_to_subr *)&local_88,QueuedConnection,&local_58);
    if (endStream) {
      finishStream(this,local_70,QueuedConnection);
    }
  }
LAB_001f545f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::handleHeadersReceived(const HPack::HttpHeader &headers, bool endStream)
{
    QHttp2Stream *stream = qobject_cast<QHttp2Stream *>(sender());
    auto &requestPair = requestReplyPairs[stream];
    auto *httpReply = requestPair.second;
    auto &httpRequest = requestPair.first;
    Q_ASSERT(httpReply || stream->state() == QHttp2Stream::State::ReservedRemote);

    auto *httpReplyPrivate = httpReply->d_func();

    // For HTTP/1 'location' is handled (and redirect URL set) when a protocol
    // handler emits channel->allDone(). Http/2 protocol handler never emits
    // allDone, since we have many requests multiplexed in one channel at any
    // moment and we are probably not done yet. So we extract url and set it
    // here, if needed.
    int statusCode = 0;
    for (const auto &pair : headers) {
        const auto &name = pair.name;
        const auto value = QByteArrayView(pair.value);

        // TODO: part of this code copies what SPDY protocol handler does when
        // processing headers. Binary nature of HTTP/2 and SPDY saves us a lot
        // of parsing and related errors/bugs, but it would be nice to have
        // more detailed validation of headers.
        if (name == ":status") {
            statusCode = value.left(3).toInt();
            httpReply->setStatusCode(statusCode);
            m_channel->lastStatus = statusCode; // Mostly useless for http/2, needed for auth
            httpReply->setReasonPhrase(QString::fromLatin1(value.mid(4)));
        } else if (name == ":version") {
            httpReply->setMajorVersion(value.at(5) - '0');
            httpReply->setMinorVersion(value.at(7) - '0');
        } else if (name == "content-length") {
            bool ok = false;
            const qlonglong length = value.toLongLong(&ok);
            if (ok)
                httpReply->setContentLength(length);
        } else {
            const auto binder = name == "set-cookie" ? QByteArrayView("\n") : QByteArrayView(", ");
            httpReply->appendHeaderField(name, QByteArray(pair.value).replace('\0', binder));
        }
    }

    // Discard all informational (1xx) replies with the exception of 101.
    // Also see RFC 9110 (Chapter 15.2)
    if (statusCode == 100 || (102 <= statusCode && statusCode <= 199)) {
        httpReplyPrivate->clearHttpLayerInformation();
        return;
    }

    if (QHttpNetworkReply::isHttpRedirect(statusCode) && httpRequest.isFollowRedirects()) {
        QHttpNetworkConnectionPrivate::ParseRedirectResult
                result = QHttpNetworkConnectionPrivate::parseRedirectResponse(httpReply);
        if (result.errorCode != QNetworkReply::NoError) {
            auto errorString = m_connection->d_func()->errorDetail(result.errorCode, m_socket);
            finishStreamWithError(stream, result.errorCode, errorString);
            stream->sendRST_STREAM(INTERNAL_ERROR);
            return;
        }

        if (result.redirectUrl.isValid())
            httpReply->setRedirectUrl(result.redirectUrl);
    }

    if (httpReplyPrivate->isCompressed() && httpRequest.d->autoDecompress)
        httpReplyPrivate->removeAutoDecompressHeader();

    if (QHttpNetworkReply::isHttpRedirect(statusCode)) {
        // Note: This status code can trigger uploadByteDevice->reset() in
        // QHttpNetworkConnectionChannel::handleStatus. Alas, we have no single
        // request/reply, we multiplex several requests and thus we never simply
        // call 'handleStatus'. If we have a byte-device - we try to reset it
        // here, we don't (and can't) handle any error during reset operation.
        if (auto *byteDevice = httpRequest.uploadByteDevice()) {
            byteDevice->reset();
            httpReplyPrivate->totallyUploadedData = 0;
        }
    }

    QMetaObject::invokeMethod(httpReply, &QHttpNetworkReply::headerChanged, Qt::QueuedConnection);
    if (endStream)
        finishStream(stream, Qt::QueuedConnection);
}